

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

int str_diff_idx(char *a,char *b)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (a == (char *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x83,"int str_diff_idx(const char *, const char *)");
  }
  if (b == (char *)0x0) {
    __assert_fail("b != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x84,"int str_diff_idx(const char *, const char *)");
  }
  sVar1 = strlen(a);
  sVar2 = strlen(b);
  if (sVar1 < sVar2) {
    sVar2 = sVar1;
  }
  sVar3 = 0;
  sVar1 = sVar3;
  if (sVar2 != 0) {
    do {
      sVar1 = sVar3;
      if (a[sVar3] != b[sVar3]) break;
      sVar3 = sVar3 + 1;
      sVar1 = sVar2;
    } while (sVar2 != sVar3);
  }
  return (int)sVar1;
}

Assistant:

int str_diff_idx(const char * a, const char * b)
{
    assert(a != NULL);
    assert(b != NULL);

    int i = 0;

    size_t lena = strlen(a);
    size_t lenb = strlen(b);

    size_t minlen = lena < lenb ? lena : lenb;

    for (; i < minlen; i++)
        if (a[i] != b[i])
            break;

    return i;
}